

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geo_parquet.cpp
# Opt level: O1

void __thiscall
duckdb::GeoParquetFileMetadata::FlushColumnMeta
          (GeoParquetFileMetadata *this,string *column_name,GeoParquetColumnMetadata *meta)

{
  double dVar1;
  int iVar2;
  mapped_type *pmVar3;
  double dVar4;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar2 == 0) {
    pmVar3 = ::std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::GeoParquetColumnMetadata>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::GeoParquetColumnMetadata>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::GeoParquetColumnMetadata>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::GeoParquetColumnMetadata>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&this->geometry_columns,column_name);
    ::std::
    _Rb_tree<duckdb::WKBGeometryType,duckdb::WKBGeometryType,std::_Identity<duckdb::WKBGeometryType>,std::less<duckdb::WKBGeometryType>,std::allocator<duckdb::WKBGeometryType>>
    ::_M_insert_range_unique<std::_Rb_tree_const_iterator<duckdb::WKBGeometryType>>
              ((_Rb_tree<duckdb::WKBGeometryType,duckdb::WKBGeometryType,std::_Identity<duckdb::WKBGeometryType>,std::less<duckdb::WKBGeometryType>,std::allocator<duckdb::WKBGeometryType>>
                *)&pmVar3->geometry_types,
               (meta->geometry_types)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
               (_Rb_tree_const_iterator<duckdb::WKBGeometryType>)
               &(meta->geometry_types)._M_t._M_impl.super__Rb_tree_header);
    dVar4 = (meta->bbox).min_x;
    dVar1 = (pmVar3->bbox).min_x;
    if (dVar1 <= dVar4) {
      dVar4 = dVar1;
    }
    (pmVar3->bbox).min_x = dVar4;
    dVar4 = (meta->bbox).max_x;
    dVar1 = (pmVar3->bbox).max_x;
    if (dVar4 <= dVar1) {
      dVar4 = dVar1;
    }
    (pmVar3->bbox).max_x = dVar4;
    dVar4 = (meta->bbox).min_y;
    dVar1 = (pmVar3->bbox).min_y;
    if (dVar1 <= dVar4) {
      dVar4 = dVar1;
    }
    (pmVar3->bbox).min_y = dVar4;
    dVar4 = (meta->bbox).max_y;
    dVar1 = (pmVar3->bbox).max_y;
    if (dVar4 <= dVar1) {
      dVar4 = dVar1;
    }
    (pmVar3->bbox).max_y = dVar4;
    pthread_mutex_unlock((pthread_mutex_t *)this);
    return;
  }
  ::std::__throw_system_error(iVar2);
}

Assistant:

void GeoParquetFileMetadata::FlushColumnMeta(const string &column_name, const GeoParquetColumnMetadata &meta) {
	// Lock the metadata
	lock_guard<mutex> glock(write_lock);

	auto &column = geometry_columns[column_name];

	// Combine the metadata
	column.geometry_types.insert(meta.geometry_types.begin(), meta.geometry_types.end());
	column.bbox.Combine(meta.bbox);
}